

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void __thiscall
rpc_tests::rpc_getblockstats_calculate_percentiles_by_weight::test_method
          (rpc_getblockstats_calculate_percentiles_by_weight *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  undefined4 local_3ac;
  assertion_result local_3a8;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> feerates;
  undefined4 *local_170;
  assertion_result local_168;
  undefined4 **local_150;
  undefined4 **local_148;
  assertion_result local_140;
  undefined4 ***local_128;
  undefined4 ***local_120;
  char *local_118;
  assertion_result local_110;
  CAmount result4 [5];
  CAmount result3 [5];
  CAmount result2 [5];
  CAmount result [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result[4] = 0;
  result[2] = 0;
  result[3] = 0;
  result[0] = 0;
  result[1] = 0;
  lVar4 = 100;
  do {
    result2[0] = CONCAT44(result2[0]._4_4_,1);
    result3[0] = CONCAT44(result3[0]._4_4_,1);
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
               (int *)result2,(int *)result3);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 100;
  do {
    result2[0] = CONCAT44(result2[0]._4_4_,2);
    result3[0] = CONCAT44(result3[0]._4_4_,1);
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
               (int *)result2,(int *)result3);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  CalculatePercentilesByWeight(result,&feerates,200);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1ba;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01388f08;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_110._0_8_ = &local_120;
  local_120._0_4_ = 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_168.m_message.px = (element_type *)0xe9cfb4;
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_3a8._0_8_ = result;
  result3[3] = (CAmount)&local_110;
  result2[3] = (CAmount)&local_3a8;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result[0] == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)result4,1,2,REQUIRE,0xea0c66,(size_t)&local_168,0x1ba,
             result2,"1",result3);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1bb;
  file_00.m_begin = (iterator)&local_1b8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01388f08;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8._0_8_ = result + 1;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result[1] == 1);
  local_120._0_4_ = 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_168.m_message.px = (element_type *)0xe9cfb4;
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_110._0_8_ = &local_120;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  result2[3] = (CAmount)&local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)result4,1,2,REQUIRE,0xea0c70,(size_t)&local_168,0x1bb,
             result2,"1",result3);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1bc;
  file_01.m_begin = (iterator)&local_1d8;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e8,
             msg_01);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01388f08;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8._0_8_ = result + 2;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result[2] == 1);
  local_120._0_4_ = 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_168.m_message.px = (element_type *)0xe9cfb4;
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_110._0_8_ = &local_120;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  result2[3] = (CAmount)&local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)result4,1,2,REQUIRE,0xea0c7a,(size_t)&local_168,0x1bc,
             result2,"1",result3);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1bd;
  file_02.m_begin = (iterator)&local_1f8;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_208,
             msg_02);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01388f08;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8._0_8_ = result + 3;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result[3] == 2);
  local_120._0_4_ = 2;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_168.m_message.px = (element_type *)0xe9cfb4;
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_110._0_8_ = &local_120;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  result2[3] = (CAmount)&local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)result4,1,2,REQUIRE,0xea0c84,(size_t)&local_168,0x1bd,
             result2,"2",result3);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1be;
  file_03.m_begin = (iterator)&local_218;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_228,
             msg_03);
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_01388f08;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8._0_8_ = result + 4;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result[4] == 2);
  local_120 = (undefined4 ***)CONCAT44(local_120._4_4_,2);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_168.m_message.px = (element_type *)0xe9cfb4;
  result2[1] = result2[1] & 0xffffffffffffff00;
  result2[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result2[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_110._0_8_ = &local_120;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  result2[3] = (CAmount)&local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)result4,1,2,REQUIRE,0xea0c8e,(size_t)&local_168,0x1be,
             result2,"2",result3);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  result2[2] = 0;
  result2[3] = 0;
  result2[0] = 0;
  result2[1] = 0;
  result2[4] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  result3[0] = CONCAT44(result3[0]._4_4_,1);
  result4[0] = CONCAT44(result4[0]._4_4_,9);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,2);
  result4[0] = CONCAT44(result4[0]._4_4_,0x10);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,4);
  result4[0] = CONCAT44(result4[0]._4_4_,0x32);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,5);
  result4[0] = CONCAT44(result4[0]._4_4_,10);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  result3[0] = CONCAT44(result3[0]._4_4_,9);
  result4[0] = CONCAT44(result4[0]._4_4_,0xf);
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result3,(int *)result4);
  CalculatePercentilesByWeight(result2,&feerates,100);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1cd;
  file_04.m_begin = (iterator)&local_238;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_248,
             msg_04);
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_01388f08;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (undefined4 ***)0xf4aea1;
  local_120 = &local_148;
  local_148._0_4_ = 2;
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8.m_message.px = (element_type *)0xe9cfb4;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_110._0_8_ = result2;
  result3[3] = (CAmount)&local_110;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result2[0] == 2);
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_140,1,2,REQUIRE,0xea0c98,(size_t)&local_3a8,0x1cd,
             result3,"2",result4);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1ce;
  file_05.m_begin = (iterator)&local_258;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_268,
             msg_05);
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_01388f08;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (undefined4 ***)0xf4aea1;
  local_110._0_8_ = result2 + 1;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result2[1] == 2);
  local_148._0_4_ = 2;
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8.m_message.px = (element_type *)0xe9cfb4;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_148;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_140,1,2,REQUIRE,0xea0ca3,(size_t)&local_3a8,0x1ce,
             result3,"2",result4);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1cf;
  file_06.m_begin = (iterator)&local_278;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288,
             msg_06);
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_01388f08;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (undefined4 ***)0xf4aea1;
  local_110._0_8_ = result2 + 2;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result2[2] == 4);
  local_148._0_4_ = 4;
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8.m_message.px = (element_type *)0xe9cfb4;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_148;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_140,1,2,REQUIRE,0xea0cae,(size_t)&local_3a8,0x1cf,
             result3,"4",result4);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1d0;
  file_07.m_begin = (iterator)&local_298;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2a8,
             msg_07);
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_01388f08;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (undefined4 ***)0xf4aea1;
  local_110._0_8_ = result2 + 3;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result2[3] == 4);
  local_148._0_4_ = 4;
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8.m_message.px = (element_type *)0xe9cfb4;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_148;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_140,1,2,REQUIRE,0xea0cb9,(size_t)&local_3a8,0x1d0,
             result3,"4",result4);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1d1;
  file_08.m_begin = (iterator)&local_2b8;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c8,
             msg_08);
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_01388f08;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = (undefined4 ***)0xf4aea1;
  local_110._0_8_ = result2 + 4;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result2[4] == 9);
  local_148 = (undefined4 **)CONCAT44(local_148._4_4_,9);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a8.m_message.px = (element_type *)0xe9cfb4;
  result3[1] = result3[1] & 0xffffffffffffff00;
  result3[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result3[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_148;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013890c8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  result3[3] = (CAmount)&local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_140,1,2,REQUIRE,0xea0cc4,(size_t)&local_3a8,0x1d1,
             result3,"9",result4);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  result3[2] = 0;
  result3[3] = 0;
  result3[0] = 0;
  result3[1] = 0;
  result3[4] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  result4[0] = CONCAT44(result4[0]._4_4_,1);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x9;
  local_140._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xb;
  local_140._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  result4[0] = CONCAT44(result4[0]._4_4_,2);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x5;
  local_140._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  result4[0] = CONCAT44(result4[0]._4_4_,4);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x32;
  local_140._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  result4[0] = CONCAT44(result4[0]._4_4_,5);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xa;
  local_140._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  result4[0] = CONCAT44(result4[0]._4_4_,9);
  local_140._0_4_ = 0xf;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)result4,(int *)&local_140);
  CalculatePercentilesByWeight(result3,&feerates,100);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1e1;
  file_09.m_begin = (iterator)&local_2d8;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2e8,
             msg_09);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined4 **)0xf4aea1;
  local_148 = &local_170;
  local_170._0_4_ = 2;
  local_3a8.m_message.px = (element_type *)0x0;
  local_3a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xe9cfb4;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013890c8;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_120 = (undefined4 ***)result3;
  local_3a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result3[0] == 2);
  boost::test_tools::tt_detail::report_assertion
            (&local_3a8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xea0ccf,(size_t)&local_110,0x1e1,
             result4,"2",&local_140);
  boost::detail::shared_count::~shared_count(&local_3a8.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1e2;
  file_10.m_begin = (iterator)&local_2f8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_308,
             msg_10);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined4 **)0xf4aea1;
  local_120 = (undefined4 ***)(result3 + 1);
  local_3a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result3[1] == 2);
  local_170._0_4_ = 2;
  local_3a8.m_message.px = (element_type *)0x0;
  local_3a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xe9cfb4;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  local_148 = &local_170;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013890c8;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xea0cda,(size_t)&local_110,0x1e2,
             result4,"2",&local_140);
  boost::detail::shared_count::~shared_count(&local_3a8.m_message.pn);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x1e3;
  file_11.m_begin = (iterator)&local_318;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_328,
             msg_11);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined4 **)0xf4aea1;
  local_120 = (undefined4 ***)(result3 + 2);
  local_3a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result3[2] == 4);
  local_170._0_4_ = 4;
  local_3a8.m_message.px = (element_type *)0x0;
  local_3a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xe9cfb4;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  local_148 = &local_170;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013890c8;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xea0ce5,(size_t)&local_110,0x1e3,
             result4,"4",&local_140);
  boost::detail::shared_count::~shared_count(&local_3a8.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1e4;
  file_12.m_begin = (iterator)&local_338;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_348,
             msg_12);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined4 **)0xf4aea1;
  local_120 = (undefined4 ***)(result3 + 3);
  local_3a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result3[3] == 4);
  local_170._0_4_ = 4;
  local_3a8.m_message.px = (element_type *)0x0;
  local_3a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xe9cfb4;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  local_148 = &local_170;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013890c8;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xea0cf0,(size_t)&local_110,0x1e4,
             result4,"4",&local_140);
  boost::detail::shared_count::~shared_count(&local_3a8.m_message.pn);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x1e5;
  file_13.m_begin = (iterator)&local_358;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_368,
             msg_13);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_01388f08;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined4 **)0xf4aea1;
  local_120 = (undefined4 ***)(result3 + 4);
  local_3a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(result3[4] == 9);
  local_170 = (undefined4 *)CONCAT44(local_170._4_4_,9);
  local_3a8.m_message.px = (element_type *)0x0;
  local_3a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xe9cfb4;
  result4[1] = result4[1] & 0xffffffffffffff00;
  result4[0] = (CAmount)&PTR__lazy_ostream_013892a8;
  result4[2] = (CAmount)boost::unit_test::lazy_ostream::inst;
  result4[3] = (CAmount)&local_120;
  local_148 = &local_170;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013890c8;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xea0cfb,(size_t)&local_110,0x1e5,
             result4,"9",&local_140);
  boost::detail::shared_count::~shared_count(&local_3a8.m_message.pn);
  result4[2] = 0;
  result4[3] = 0;
  result4[0] = 0;
  result4[1] = 0;
  result4[4] = 0;
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_140._1_3_ = 0;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x64;
  local_168._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_140,(int *)&local_168);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x2;
  local_140._1_3_ = 0;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_168._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_140,(int *)&local_168);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_140._1_3_ = 0;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_168._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_140,(int *)&local_168);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_140._1_3_ = 0;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_168._1_3_ = 0;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_140,(int *)&local_168);
  local_140._0_4_ = 999999;
  local_168._0_4_ = 1;
  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::emplace_back<int,int>
            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&feerates,
             (int *)&local_140,(int *)&local_168);
  CalculatePercentilesByWeight(result4,&feerates,0x68);
  lVar4 = 0;
  do {
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x1f5;
    file_14.m_begin = (iterator)&local_378;
    msg_14.m_end = pvVar3;
    msg_14.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_388,
               msg_14);
    local_3a8.m_message.px = (element_type *)((ulong)local_3a8.m_message.px & 0xffffffffffffff00);
    local_3a8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_3a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_390 = "";
    local_148 = (undefined4 **)((long)result4 + lVar4);
    local_3ac = 1;
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(*local_148 == (undefined4 *)0x1);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_120 = (undefined4 ***)0xe9cf52;
    local_118 = "";
    local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
    local_140._0_8_ = &PTR__lazy_ostream_013892a8;
    local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_128 = &local_148;
    local_170 = &local_3ac;
    local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
    local_168._0_8_ = &PTR__lazy_ostream_013890c8;
    local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_150 = &local_170;
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,(lazy_ostream *)&local_3a8,1,2,REQUIRE,0xea0d06,(size_t)&local_120,0x1f5,
               &local_140,"1",&local_168);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28);
  if (feerates.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(feerates.
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)feerates.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)feerates.
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_getblockstats_calculate_percentiles_by_weight)
{
    int64_t total_weight = 200;
    std::vector<std::pair<CAmount, int64_t>> feerates;
    CAmount result[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(1 ,1);
    }

    for (int64_t i = 0; i < 100; i++) {
        feerates.emplace_back(2 ,1);
    }

    CalculatePercentilesByWeight(result, feerates, total_weight);
    BOOST_CHECK_EQUAL(result[0], 1);
    BOOST_CHECK_EQUAL(result[1], 1);
    BOOST_CHECK_EQUAL(result[2], 1);
    BOOST_CHECK_EQUAL(result[3], 2);
    BOOST_CHECK_EQUAL(result[4], 2);

    // Test with more pairs, and two pairs overlapping 2 percentiles.
    total_weight = 100;
    CAmount result2[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 16); //10th + 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15);  // 90th percentile

    CalculatePercentilesByWeight(result2, feerates, total_weight);

    BOOST_CHECK_EQUAL(result2[0], 2);
    BOOST_CHECK_EQUAL(result2[1], 2);
    BOOST_CHECK_EQUAL(result2[2], 4);
    BOOST_CHECK_EQUAL(result2[3], 4);
    BOOST_CHECK_EQUAL(result2[4], 9);

    // Same test as above, but one of the percentile-overlapping pairs is split in 2.
    total_weight = 100;
    CAmount result3[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 9);
    feerates.emplace_back(2 , 11); // 10th percentile
    feerates.emplace_back(2 , 5); // 25th percentile
    feerates.emplace_back(4 ,50); //50th + 75th percentile
    feerates.emplace_back(5 ,10);
    feerates.emplace_back(9 ,15); // 90th percentile

    CalculatePercentilesByWeight(result3, feerates, total_weight);

    BOOST_CHECK_EQUAL(result3[0], 2);
    BOOST_CHECK_EQUAL(result3[1], 2);
    BOOST_CHECK_EQUAL(result3[2], 4);
    BOOST_CHECK_EQUAL(result3[3], 4);
    BOOST_CHECK_EQUAL(result3[4], 9);

    // Test with one transaction spanning all percentiles.
    total_weight = 104;
    CAmount result4[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    feerates.clear();

    feerates.emplace_back(1, 100);
    feerates.emplace_back(2, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(3, 1);
    feerates.emplace_back(999999, 1);

    CalculatePercentilesByWeight(result4, feerates, total_weight);

    for (int64_t i = 0; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        BOOST_CHECK_EQUAL(result4[i], 1);
    }
}